

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderCodeVariableDescX::ShaderCodeVariableDescX
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDescX *Other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  pointer pSVar7;
  SHADER_CODE_BASIC_TYPE SVar8;
  Uint8 UVar9;
  Uint8 UVar10;
  Uint32 UVar11;
  Uint32 UVar12;
  Uint32 UVar13;
  
  (this->super_ShaderCodeVariableDesc).pMembers = (Other->super_ShaderCodeVariableDesc).pMembers;
  pcVar4 = (Other->super_ShaderCodeVariableDesc).Name;
  pcVar5 = (Other->super_ShaderCodeVariableDesc).TypeName;
  SVar8 = (Other->super_ShaderCodeVariableDesc).BasicType;
  UVar9 = (Other->super_ShaderCodeVariableDesc).NumRows;
  UVar10 = (Other->super_ShaderCodeVariableDesc).NumColumns;
  UVar11 = (Other->super_ShaderCodeVariableDesc).Offset;
  UVar12 = (Other->super_ShaderCodeVariableDesc).ArraySize;
  UVar13 = (Other->super_ShaderCodeVariableDesc).NumMembers;
  (this->super_ShaderCodeVariableDesc).Class = (Other->super_ShaderCodeVariableDesc).Class;
  (this->super_ShaderCodeVariableDesc).BasicType = SVar8;
  (this->super_ShaderCodeVariableDesc).NumRows = UVar9;
  (this->super_ShaderCodeVariableDesc).NumColumns = UVar10;
  (this->super_ShaderCodeVariableDesc).Offset = UVar11;
  (this->super_ShaderCodeVariableDesc).ArraySize = UVar12;
  (this->super_ShaderCodeVariableDesc).NumMembers = UVar13;
  (this->super_ShaderCodeVariableDesc).Name = pcVar4;
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar5;
  paVar1 = &(this->NameCopy).field_2;
  (this->NameCopy)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (Other->NameCopy)._M_dataplus._M_p;
  paVar2 = &(Other->NameCopy).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&(Other->NameCopy).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->NameCopy).field_2 + 8) = uVar6;
  }
  else {
    (this->NameCopy)._M_dataplus._M_p = pcVar3;
    (this->NameCopy).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->NameCopy)._M_string_length = (Other->NameCopy)._M_string_length;
  (Other->NameCopy)._M_dataplus._M_p = (pointer)paVar2;
  (Other->NameCopy)._M_string_length = 0;
  (Other->NameCopy).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->TypeNameCopy).field_2;
  (this->TypeNameCopy)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (Other->TypeNameCopy)._M_dataplus._M_p;
  paVar2 = &(Other->TypeNameCopy).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&(Other->TypeNameCopy).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->TypeNameCopy).field_2 + 8) = uVar6;
  }
  else {
    (this->TypeNameCopy)._M_dataplus._M_p = pcVar3;
    (this->TypeNameCopy).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->TypeNameCopy)._M_string_length = (Other->TypeNameCopy)._M_string_length;
  (Other->TypeNameCopy)._M_dataplus._M_p = (pointer)paVar2;
  (Other->TypeNameCopy)._M_string_length = 0;
  (Other->TypeNameCopy).field_2._M_local_buf[0] = '\0';
  pSVar7 = (Other->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Other->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar7;
  (this->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (Other->Members).
       super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (Other->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (Other->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (Other->Members).
  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ShaderCodeVariableDesc).Name = (this->NameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).TypeName = (this->TypeNameCopy)._M_dataplus._M_p;
  (this->super_ShaderCodeVariableDesc).pMembers =
       &((this->Members).
         super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_ShaderCodeVariableDesc;
  return;
}

Assistant:

ShaderCodeVariableDescX(ShaderCodeVariableDescX&& Other) noexcept :
        ShaderCodeVariableDesc{Other},
        // clang-format off
        NameCopy    {std::move(Other.NameCopy)},
        TypeNameCopy{std::move(Other.TypeNameCopy)},
        Members     {std::move(Other.Members)}
    // clang-format on
    {
        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();
        pMembers = Members.data();
    }